

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

void compile_dnref_search(compiler_common *common,PCRE2_SPTR16 cc,jump_list **backtracks)

{
  ushort uVar1;
  sljit_compiler *compiler;
  long lVar2;
  sljit_u8 *psVar3;
  sljit_jump *psVar4;
  jump_list *pjVar5;
  sljit_label *psVar6;
  sljit_sw in_RCX;
  long *plVar7;
  int iVar8;
  ushort *puVar9;
  long *local_40;
  
  compiler = common->compiler;
  uVar1 = cc[2];
  puVar9 = common->name_table + (ulong)cc[1] * common->name_entry_size;
  if (compiler->error == 0) {
    iVar8 = common->ovector_start;
    compiler->mode32 = 0;
    in_RCX = 0;
    psVar3 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar8 + 8);
    if (psVar3 != (sljit_u8 *)0x0) {
      *psVar3 = 0x8b;
    }
  }
  if (uVar1 < 2) {
    local_40 = (long *)0x0;
  }
  else {
    iVar8 = uVar1 + 1;
    local_40 = (long *)0x0;
    do {
      uVar1 = *puVar9;
      sljit_get_local_base(compiler,4,(long)common->ovector_start + (ulong)uVar1 * 0x10,in_RCX);
      in_RCX = (long)common->ovector_start + (ulong)uVar1 * 0x10;
      psVar4 = sljit_emit_cmp(compiler,1,0x8e,in_RCX,1,0);
      plVar7 = (long *)0x0;
      if (compiler->error == 0) {
        plVar7 = (long *)ensure_abuf(compiler,0x10);
      }
      if (plVar7 != (long *)0x0) {
        plVar7[1] = (long)local_40;
        *plVar7 = (long)psVar4;
        local_40 = plVar7;
      }
      puVar9 = puVar9 + common->name_entry_size;
      iVar8 = iVar8 + -1;
    } while (2 < iVar8);
  }
  uVar1 = *puVar9;
  sljit_get_local_base(compiler,4,(long)common->ovector_start + (ulong)uVar1 * 0x10,in_RCX);
  if ((backtracks != (jump_list **)0x0) && (common->unset_backref == 0)) {
    pjVar5 = (jump_list *)0x0;
    psVar4 = sljit_emit_cmp(compiler,0,0x8e,(ulong)uVar1 * 0x10 + (long)common->ovector_start,1,0);
    if (compiler->error == 0) {
      pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
    }
    if (pjVar5 != (jump_list *)0x0) {
      pjVar5->next = *backtracks;
      pjVar5->jump = psVar4;
      *backtracks = pjVar5;
    }
  }
  psVar6 = sljit_emit_label(compiler);
  for (; local_40 != (long *)0x0; local_40 = (long *)local_40[1]) {
    if ((psVar6 != (sljit_label *)0x0) && (lVar2 = *local_40, lVar2 != 0)) {
      *(ulong *)(lVar2 + 0x10) = (*(ulong *)(lVar2 + 0x10) & 0xfffffffffffffffc) + 1;
      *(sljit_label **)(lVar2 + 0x18) = psVar6;
    }
  }
  return;
}

Assistant:

static void compile_dnref_search(compiler_common *common, PCRE2_SPTR cc, jump_list **backtracks)
{
/* The OVECTOR offset goes to TMP2. */
DEFINE_COMPILER;
int count = GET2(cc, 1 + IMM2_SIZE);
PCRE2_SPTR slot = common->name_table + GET2(cc, 1) * common->name_entry_size;
unsigned int offset;
jump_list *found = NULL;

SLJIT_ASSERT(*cc == OP_DNREF || *cc == OP_DNREFI);

OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1));

count--;
while (count-- > 0)
  {
  offset = GET2(slot, 0) << 1;
  GET_LOCAL_BASE(TMP2, 0, OVECTOR(offset));
  add_jump(compiler, &found, CMP(SLJIT_NOT_EQUAL, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0));
  slot += common->name_entry_size;
  }

offset = GET2(slot, 0) << 1;
GET_LOCAL_BASE(TMP2, 0, OVECTOR(offset));
if (backtracks != NULL && !common->unset_backref)
  add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0));

set_jumps(found, LABEL());
}